

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordQueryReliablePdu.cpp
# Opt level: O0

void __thiscall
DIS::RecordQueryReliablePdu::marshal(RecordQueryReliablePdu *this,DataStream *dataStream)

{
  undefined8 uVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined1 local_30 [8];
  FourByteChunk x;
  size_t idx;
  DataStream *dataStream_local;
  RecordQueryReliablePdu *this_local;
  
  SimulationManagementWithReliabilityFamilyPdu::marshal
            (&this->super_SimulationManagementWithReliabilityFamilyPdu,dataStream);
  DataStream::operator<<(dataStream,this->_requestID);
  DataStream::operator<<(dataStream,this->_requiredReliabilityService);
  DataStream::operator<<(dataStream,this->_pad1);
  DataStream::operator<<(dataStream,this->_pad2);
  DataStream::operator<<(dataStream,this->_eventType);
  DataStream::operator<<(dataStream,this->_time);
  sVar2 = std::vector<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>::size
                    (&this->_recordIDs);
  DataStream::operator<<(dataStream,(uint)sVar2);
  x._otherParameters[0] = '\0';
  x._otherParameters[1] = '\0';
  x._otherParameters[2] = '\0';
  x._otherParameters[3] = '\0';
  x._12_4_ = 0;
  while( true ) {
    uVar1 = x._8_8_;
    sVar2 = std::vector<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>::size
                      (&this->_recordIDs);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::vector<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>::operator[]
                       (&this->_recordIDs,x._8_8_);
    FourByteChunk::FourByteChunk((FourByteChunk *)local_30,pvVar3);
    FourByteChunk::marshal((FourByteChunk *)local_30,dataStream);
    FourByteChunk::~FourByteChunk((FourByteChunk *)local_30);
    x._8_8_ = x._8_8_ + 1;
  }
  return;
}

Assistant:

void RecordQueryReliablePdu::marshal(DataStream& dataStream) const
{
    SimulationManagementWithReliabilityFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    dataStream << _requestID;
    dataStream << _requiredReliabilityService;
    dataStream << _pad1;
    dataStream << _pad2;
    dataStream << _eventType;
    dataStream << _time;
    dataStream << ( unsigned int )_recordIDs.size();

     for(size_t idx = 0; idx < _recordIDs.size(); idx++)
     {
        FourByteChunk x = _recordIDs[idx];
        x.marshal(dataStream);
     }

}